

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_BlitRect(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect)

{
  float fVar1;
  float fVar2;
  
  if (image != (GPU_Image *)0x0) {
    if (src_rect == (GPU_Rect *)0x0) {
      fVar2 = (float)image->h;
      fVar1 = (float)image->w;
      src_rect = (GPU_Rect *)0x0;
    }
    else {
      fVar1 = src_rect->w;
      fVar2 = src_rect->h;
    }
    GPU_BlitRectX(image,src_rect,target,dest_rect,0.0,fVar1 * 0.5,fVar2 * 0.5,0);
    return;
  }
  return;
}

Assistant:

void GPU_BlitRect(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect)
{
    float w = 0.0f;
    float h = 0.0f;
    
    if(image == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    GPU_BlitRectX(image, src_rect, target, dest_rect, 0.0f, w*0.5f, h*0.5f, GPU_FLIP_NONE);
}